

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O2

float plutovg_font_face_traverse_glyph_path
                (plutovg_font_face_t *face,float size,float x,float y,plutovg_codepoint_t codepoint,
                plutovg_path_traverse_func_t traverse_func,void *closure)

{
  ulong uVar1;
  ushort uVar2;
  stbtt_vertex *psVar3;
  undefined1 auVar4 [12];
  glyph_t *pgVar5;
  long lVar6;
  plutovg_path_command_t pVar7;
  int iVar8;
  long lVar9;
  float sx;
  float fVar10;
  float fVar15;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  float fVar16;
  float fVar17;
  undefined8 local_a8;
  plutovg_point_t local_88;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  plutovg_matrix_t matrix;
  undefined1 auVar12 [16];
  undefined2 uVar14;
  
  uVar2 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
  sx = size / (float)(ushort)(uVar2 << 8 | uVar2 >> 8);
  plutovg_matrix_init_translate(&matrix,x,y);
  plutovg_matrix_scale(&matrix,sx,-sx);
  pgVar5 = plutovg_font_face_get_glyph(face,codepoint);
  local_a8 = 0;
  lVar9 = 0;
  lVar6 = 0;
  do {
    if (pgVar5->nvertices <= lVar6) {
      return sx * (float)pgVar5->advance_width;
    }
    psVar3 = pgVar5->vertices;
    switch((&psVar3->type)[lVar9]) {
    case '\x01':
      auVar13 = ZEXT416(*(uint *)((long)&psVar3->x + lVar9));
      auVar13 = pshuflw(auVar13,auVar13,0x60);
      local_88.x = (float)(auVar13._0_4_ >> 0x10);
      local_88.y = (float)(auVar13._4_4_ >> 0x10);
      local_a8 = CONCAT44(local_88.y,local_88.x);
      plutovg_matrix_map_points(&matrix,&local_88,&local_88,1);
      pVar7 = PLUTOVG_PATH_COMMAND_MOVE_TO;
      break;
    case '\x02':
      auVar13 = ZEXT416(*(uint *)((long)&psVar3->x + lVar9));
      auVar13 = pshuflw(auVar13,auVar13,0x60);
      local_88.x = (float)(auVar13._0_4_ >> 0x10);
      local_88.y = (float)(auVar13._4_4_ >> 0x10);
      local_a8 = CONCAT44(local_88.y,local_88.x);
      plutovg_matrix_map_points(&matrix,&local_88,&local_88,1);
      pVar7 = PLUTOVG_PATH_COMMAND_LINE_TO;
      break;
    case '\x03':
      auVar13 = ZEXT416(*(uint *)((long)&psVar3->x + lVar9));
      auVar13 = pshuflw(auVar13,auVar13,0x60);
      fVar16 = (float)(auVar13._0_4_ >> 0x10);
      fVar17 = (float)(auVar13._4_4_ >> 0x10);
      auVar13 = ZEXT416(*(uint *)((long)&psVar3->cx + lVar9));
      auVar13 = pshuflw(auVar13,auVar13,0x60);
      fVar10 = (float)(auVar13._0_4_ >> 0x10);
      fVar15 = (float)(auVar13._4_4_ >> 0x10);
      local_88.x = fVar10 * 0.6666667 + (float)local_a8 * 0.33333334;
      local_88.y = fVar15 * 0.6666667 + local_a8._4_4_ * 0.33333334;
      fStack_80 = fVar10 * 0.6666667 + fVar16 * 0.33333334;
      fStack_7c = fVar15 * 0.6666667 + fVar17 * 0.33333334;
      local_78 = CONCAT44(fVar17,fVar16);
      plutovg_matrix_map_points(&matrix,&local_88,&local_88,3);
      (*traverse_func)(closure,PLUTOVG_PATH_COMMAND_CUBIC_TO,&local_88,3);
      local_a8 = CONCAT44(fVar17,fVar16);
      goto LAB_00104653;
    case '\x04':
      uVar1 = *(ulong *)((long)&psVar3->cx + lVar9);
      uVar14 = (undefined2)(uVar1 >> 0x30);
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar1;
      auVar12._12_2_ = uVar14;
      auVar12._14_2_ = uVar14;
      uVar14 = (undefined2)(uVar1 >> 0x20);
      auVar11._12_4_ = auVar12._12_4_;
      auVar11._8_2_ = 0;
      auVar11._0_8_ = uVar1;
      auVar11._10_2_ = uVar14;
      auVar13._10_6_ = auVar11._10_6_;
      auVar13._8_2_ = uVar14;
      auVar13._0_8_ = uVar1;
      uVar14 = (undefined2)(uVar1 >> 0x10);
      auVar4._4_8_ = auVar13._8_8_;
      auVar4._2_2_ = uVar14;
      auVar4._0_2_ = uVar14;
      local_88.x = (float)(int)(short)uVar1;
      local_88.y = (float)(auVar4._0_4_ >> 0x10);
      fStack_80 = (float)(auVar13._8_4_ >> 0x10);
      fStack_7c = (float)(auVar11._12_4_ >> 0x10);
      auVar13 = ZEXT416(*(uint *)((long)&psVar3->x + lVar9));
      auVar13 = pshuflw(auVar13,auVar13,0x60);
      fVar10 = (float)(auVar13._0_4_ >> 0x10);
      fVar15 = (float)(auVar13._4_4_ >> 0x10);
      local_a8 = CONCAT44(fVar15,fVar10);
      local_78 = CONCAT44(fVar15,fVar10);
      iVar8 = 3;
      plutovg_matrix_map_points(&matrix,&local_88,&local_88,3);
      pVar7 = PLUTOVG_PATH_COMMAND_CUBIC_TO;
      goto LAB_00104650;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-font.c"
                    ,0x166,
                    "float plutovg_font_face_traverse_glyph_path(plutovg_font_face_t *, float, float, float, plutovg_codepoint_t, plutovg_path_traverse_func_t, void *)"
                   );
    }
    iVar8 = 1;
LAB_00104650:
    (*traverse_func)(closure,pVar7,&local_88,iVar8);
LAB_00104653:
    lVar6 = lVar6 + 1;
    lVar9 = lVar9 + 0xe;
  } while( true );
}

Assistant:

float plutovg_font_face_traverse_glyph_path(plutovg_font_face_t* face, float size, float x, float y, plutovg_codepoint_t codepoint, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    float scale = plutovg_font_face_get_scale(face, size);
    plutovg_matrix_t matrix;
    plutovg_matrix_init_translate(&matrix, x, y);
    plutovg_matrix_scale(&matrix, scale, -scale);

    plutovg_point_t points[3];
    plutovg_point_t current_point = {0, 0};
    glyph_t* glyph = plutovg_font_face_get_glyph(face, codepoint);
    for(int i = 0; i < glyph->nvertices; i++) {
        switch(glyph->vertices[i].type) {
        case STBTT_vmove:
            points[0].x = glyph->vertices[i].x;
            points[0].y = glyph->vertices[i].y;
            current_point = points[0];
            plutovg_matrix_map_points(&matrix, points, points, 1);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, 1);
            break;
        case STBTT_vline:
            points[0].x = glyph->vertices[i].x;
            points[0].y = glyph->vertices[i].y;
            current_point = points[0];
            plutovg_matrix_map_points(&matrix, points, points, 1);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, points, 1);
            break;
        case STBTT_vcurve:
            points[0].x = 2.f / 3.f * glyph->vertices[i].cx + 1.f / 3.f * current_point.x;
            points[0].y = 2.f / 3.f * glyph->vertices[i].cy + 1.f / 3.f * current_point.y;
            points[1].x = 2.f / 3.f * glyph->vertices[i].cx + 1.f / 3.f * glyph->vertices[i].x;
            points[1].y = 2.f / 3.f * glyph->vertices[i].cy + 1.f / 3.f * glyph->vertices[i].y;
            points[2].x = glyph->vertices[i].x;
            points[2].y = glyph->vertices[i].y;
            current_point = points[2];
            plutovg_matrix_map_points(&matrix, points, points, 3);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        case STBTT_vcubic:
            points[0].x = glyph->vertices[i].cx;
            points[0].y = glyph->vertices[i].cy;
            points[1].x = glyph->vertices[i].cx1;
            points[1].y = glyph->vertices[i].cy1;
            points[2].x = glyph->vertices[i].x;
            points[2].y = glyph->vertices[i].y;
            current_point = points[2];
            plutovg_matrix_map_points(&matrix, points, points, 3);
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        default:
            assert(false);
        }
    }

    return glyph->advance_width * scale;
}